

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helix.cc
# Opt level: O0

helix_protocol_t helix_protocol_lookup(char *name)

{
  string *psVar1;
  bool bVar2;
  protocol *ppVar3;
  string *in_RDI;
  string *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  itch50_protocol *in_stack_fffffffffffffe60;
  pmd_protocol *this;
  undefined1 local_109 [40];
  allocator local_e1;
  string local_e0 [38];
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [38];
  undefined1 local_6a;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  string *local_10;
  helix_protocol_t local_8;
  
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,(char *)in_RDI,&local_31);
  bVar2 = helix::nasdaq::nordic_itch_protocol::supports(in_stack_fffffffffffffe50);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  psVar1 = local_10;
  if (bVar2) {
    ppVar3 = (protocol *)operator_new(0x28);
    local_6a = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,(char *)local_10,&local_69);
    helix::nasdaq::nordic_itch_protocol::nordic_itch_protocol
              ((nordic_itch_protocol *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    local_6a = 0;
    local_8 = wrap(ppVar3);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,(char *)psVar1,&local_91);
    bVar2 = helix::nasdaq::itch50_protocol::supports((string *)0x139da9);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    psVar1 = local_10;
    if (bVar2) {
      ppVar3 = (protocol *)operator_new(0x28);
      local_ba = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,(char *)local_10,&local_b9);
      helix::nasdaq::itch50_protocol::itch50_protocol
                (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      local_ba = 0;
      local_8 = wrap(ppVar3);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e0,(char *)psVar1,&local_e1);
      bVar2 = helix::parity::pmd_protocol::supports((string *)0x139f70);
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      if (bVar2) {
        ppVar3 = (protocol *)operator_new(0x28);
        this = (pmd_protocol *)local_109;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)(local_109 + 1),(char *)local_10,(allocator *)this);
        helix::parity::pmd_protocol::pmd_protocol(this,local_10);
        local_8 = wrap(ppVar3);
        std::__cxx11::string::~string((string *)(local_109 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_109);
      }
      else {
        local_8 = (helix_protocol_t)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

helix_protocol_t helix_protocol_lookup(const char *name)
{
    if (helix::nasdaq::nordic_itch_protocol::supports(name)) {
        return wrap(new helix::nasdaq::nordic_itch_protocol{name});
    }
    if (helix::nasdaq::itch50_protocol::supports(name)) {
        return wrap(new helix::nasdaq::itch50_protocol{name});
    }
    if (helix::parity::pmd_protocol::supports(name)) {
        return wrap(new helix::parity::pmd_protocol{name});
    }
    return NULL;
}